

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

_Bool Check(DecodeStatus *Out,DecodeStatus In)

{
  DecodeStatus In_local;
  DecodeStatus *Out_local;
  undefined1 local_1;
  
  if (In == MCDisassembler_Fail) {
    *Out = MCDisassembler_Fail;
    local_1 = false;
  }
  else if (In == MCDisassembler_SoftFail) {
    *Out = MCDisassembler_SoftFail;
    local_1 = true;
  }
  else if (In == MCDisassembler_Success) {
    local_1 = true;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool Check(DecodeStatus *Out, DecodeStatus In)
{
	switch (In) {
		case MCDisassembler_Success:
			// Out stays the same.
			return true;
		case MCDisassembler_SoftFail:
			*Out = In;
			return true;
		case MCDisassembler_Fail:
			*Out = In;
			return false;
		default:	// never reached
			return false;
	}
}